

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlDependence.h
# Opt level: O3

void __thiscall
dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
          (LLVMControlDependenceAnalysis *this,Module *module,
          LLVMControlDependenceAnalysisOptions *opts,LLVMPointerAnalysis *pta)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined7 uVar5;
  
  this->_module = module;
  paVar1 = &(this->_options).super_LLVMAnalysisOptions.entryFunction.field_2;
  (this->_options).super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (opts->super_LLVMAnalysisOptions).entryFunction._M_dataplus._M_p;
  paVar2 = &(opts->super_LLVMAnalysisOptions).entryFunction.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(opts->super_LLVMAnalysisOptions).entryFunction.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_options).super_LLVMAnalysisOptions.entryFunction.field_2 + 8) =
         uVar4;
  }
  else {
    (this->_options).super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = pcVar3;
    (this->_options).super_LLVMAnalysisOptions.entryFunction.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->_options).super_LLVMAnalysisOptions.entryFunction._M_string_length =
       (opts->super_LLVMAnalysisOptions).entryFunction._M_string_length;
  (opts->super_LLVMAnalysisOptions).entryFunction._M_dataplus._M_p = (pointer)paVar2;
  (opts->super_LLVMAnalysisOptions).entryFunction._M_string_length = 0;
  (opts->super_LLVMAnalysisOptions).entryFunction.field_2._M_local_buf[0] = '\0';
  uVar5 = *(undefined7 *)
           &(opts->super_ControlDependenceAnalysisOptions).super_AnalysisOptions.field_0x1;
  (this->_options).super_ControlDependenceAnalysisOptions.super_AnalysisOptions.fieldSensitivity =
       (opts->super_ControlDependenceAnalysisOptions).super_AnalysisOptions.fieldSensitivity;
  *(undefined7 *)
   &(this->_options).super_ControlDependenceAnalysisOptions.super_AnalysisOptions.field_0x1 = uVar5;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->_options).super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
              allocationFunctions._M_t._M_impl.super__Rb_tree_header,
             &(opts->super_ControlDependenceAnalysisOptions).super_AnalysisOptions.
              allocationFunctions._M_t._M_impl.super__Rb_tree_header);
  (this->_options).super_ControlDependenceAnalysisOptions.interprocedural =
       (opts->super_ControlDependenceAnalysisOptions).interprocedural;
  (this->_options).super_ControlDependenceAnalysisOptions.algorithm =
       (opts->super_ControlDependenceAnalysisOptions).algorithm;
  *(undefined2 *)&(this->_options).super_ControlDependenceAnalysisOptions.field_0x3d =
       *(undefined2 *)&(opts->super_ControlDependenceAnalysisOptions).field_0x3d;
  (this->_impl)._M_t.
  super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
  .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl =
       (LLVMControlDependenceAnalysisImpl *)0x0;
  (this->_interprocImpl)._M_t.
  super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
  .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl =
       (LLVMControlDependenceAnalysisImpl *)0x0;
  dg::LLVMControlDependenceAnalysis::initializeImpl((LLVMPointerAnalysis *)this,(CallGraph *)pta);
  return;
}

Assistant:

LLVMControlDependenceAnalysis(const llvm::Module *module,
                                  LLVMControlDependenceAnalysisOptions opts,
                                  LLVMPointerAnalysis *pta = nullptr)
            : _module(module), _options(std::move(opts)) {
        initializeImpl(pta);
    }